

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68000_rol_r_16(m68k_info *info)

{
  build_r(info,0x13c,'\x02');
  return;
}

Assistant:

static void d68000_rol_r_16(m68k_info *info)
{
	build_r(info, M68K_INS_ROL, 2);
}